

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# networkDefaults.cpp
# Opt level: O2

int helics::getDefaultPort(int coreType)

{
  if (coreType - 1U < 0xe) {
    return *(int *)(&DAT_0034469c + (ulong)(coreType - 1U) * 4);
  }
  return -1;
}

Assistant:

int getDefaultPort(int coreType)
{
    switch (coreType) {
        case HELICS_CORE_TYPE_TCP:
            return network::DEFAULT_TCP_PORT;
        case HELICS_CORE_TYPE_TCP_SS:
            return network::DEFAULT_TCPSS_PORT;
        case HELICS_CORE_TYPE_ZMQ:
            return network::DEFAULT_ZMQ_PORT;
        case HELICS_CORE_TYPE_ZMQ_SS:
            return network::DEFAULT_ZMQSS_PORT;
        case HELICS_CORE_TYPE_UDP:
            return network::DEFAULT_UDP_PORT;
        case HELICS_CORE_TYPE_HTTP:
        case HELICS_CORE_TYPE_WEBSOCKET:
            return 80;
        default:
            return (-1);
    }
}